

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

bool __thiscall
ICM::Compiler::PreliminaryCompile::compileIfSub
          (PreliminaryCompile *this,NodeRange *nr,VecElt *condList,
          vector<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,_std::allocator<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
          *dolists)

{
  Element *elt;
  pointer pvVar1;
  Element *pEVar2;
  byte bVar3;
  KeywordID KVar4;
  Element *elt_00;
  undefined8 extraout_RAX;
  undefined8 uVar5;
  undefined8 extraout_RAX_00;
  Element *e;
  Element *pEVar6;
  initializer_list<ICM::ASTBase::Element> __l;
  allocator_type local_59;
  VecElt elsedolist;
  __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
  local_40;
  __normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>
  local_38;
  Element *this_00;
  
  elt = (nr->
        super_RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
        )._begin._M_current;
  elt_00 = adjustElement(this,elt);
  checkBoolExp(this,elt_00);
  std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::push_back
            (condList,elt);
  local_40._M_current._0_4_ = 0x1b04;
  local_38._M_current = (Element *)0x0;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_40;
  std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::vector
            (&elsedolist,__l,&local_59);
  std::
  vector<std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>,std::allocator<std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>>>
  ::emplace_back<std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>>
            ((vector<std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>,std::allocator<std::vector<ICM::ASTBase::Element,std::allocator<ICM::ASTBase::Element>>>>
              *)dolists,&elsedolist);
  std::_Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::~_Vector_base
            (&elsedolist.
              super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>);
  pvVar1 = (dolists->
           super__Vector_base<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,_std::allocator<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pEVar2 = (nr->
           super_RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
           )._end._M_current;
  uVar5 = extraout_RAX;
  pEVar6 = (nr->
           super_RangeBase<__gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>,___gnu_cxx::__normal_iterator<ICM::ASTBase::Element_*,_std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
           )._begin._M_current;
  do {
    bVar3 = (byte)uVar5;
    this_00 = pEVar6 + 1;
    if (this_00 == pEVar2) {
LAB_0014a272:
      return (bool)(this_00 == pEVar2 | bVar3 & 1);
    }
    if ((this_00->field_0).field_0.etype == '\x04') {
      KVar4 = ASTBase::Element::getKeyword(this_00);
      if (KVar4 == elsif_) {
        elsedolist.super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
        ._M_impl.super__Vector_impl_data._M_start = pEVar6 + 2;
        if (pEVar2 <= pEVar6 + 2) {
          elsedolist.
          super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl.
          super__Vector_impl_data._M_start = pEVar2;
        }
        elsedolist.super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
        ._M_impl.super__Vector_impl_data._M_finish = pEVar2;
        bVar3 = compileIfSub(this,(NodeRange *)&elsedolist,condList,dolists);
        goto LAB_0014a272;
      }
      KVar4 = ASTBase::Element::getKeyword(this_00);
      if (KVar4 == else_) {
        local_40._M_current = pEVar6 + 2;
        if (pEVar2 <= pEVar6 + 2) {
          local_40._M_current = pEVar2;
        }
        local_38._M_current = pEVar2;
        createDoList(&elsedolist,this,(NodeRange *)&local_40);
        std::
        vector<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,_std::allocator<std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>_>_>
        ::push_back(dolists,&elsedolist);
        std::_Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::
        ~_Vector_base(&elsedolist.
                       super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                     );
        bVar3 = 1;
        goto LAB_0014a272;
      }
    }
    std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::push_back
              (pvVar1 + -1,this_00);
    uVar5 = extraout_RAX_00;
    pEVar6 = this_00;
  } while( true );
}

Assistant:

bool compileIfSub(const NodeRange &nr, VecElt &condList, vector<VecElt> &dolists) {
				Element &bexp = *nr.begin();
				checkBoolExp(adjustElement(bexp));
				condList.push_back(bexp);
				dolists.push_back(VecElt{ Element::Keyword(do_) });
				VecElt &dolist = dolists.back();

				auto ib = nr.begin() + 1;
				auto ie = nr.end();
				for (auto iter = ib; iter != ie; ++iter) {
					Element &e = *iter;
					if (e.isKeyword()) {
						if (e.getKeyword() == elsif_) {
							return compileIfSub(rangei(iter + 1, ie), condList, dolists);
						}
						else if (e.getKeyword() == else_) {
							VecElt elsedolist = createDoList(rangei(iter + 1, ie));
							dolists.push_back(elsedolist);
							return true;
						}
					}
					dolist.push_back(e);
				}
				return true;
			}